

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f::RingIndexTest_RingIndex1_Test::TestBody(RingIndexTest_RingIndex1_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  RingIndex *lhs;
  char *pcVar2;
  AssertHelper local_130;
  Message local_128;
  RingIndex local_120;
  RingIndex local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  int local_b4;
  RingIndex local_b0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  int local_7c;
  RingIndex local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  RingIndex ri;
  RingIndexTest_RingIndex1_Test *this_local;
  
  Sledge::RingIndex::RingIndex((RingIndex *)&gtest_ar.message_,0x16,0x17);
  lhs = Sledge::RingIndex::operator++((RingIndex *)&gtest_ar.message_);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,int>
            ((EqHelper<false> *)local_30,"++ri","0",lhs,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  Sledge::RingIndex::operator+(&local_78,(RawType)&gtest_ar.message_);
  local_7c = 0;
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,int>
            ((EqHelper<false> *)local_68,"ri + 23","0",&local_78,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  Sledge::RingIndex::operator+(&local_b0,(RawType)&gtest_ar.message_);
  local_b4 = 1;
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,int>
            ((EqHelper<false> *)local_a0,"ri + 24","1",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  Sledge::RingIndex::operator+=((RingIndex *)&gtest_ar.message_,5);
  local_dc = 5;
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,int>
            ((EqHelper<false> *)local_d8,"ri","5",(RingIndex *)&gtest_ar.message_,&local_dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  this_00 = &gtest_ar.message_;
  Sledge::RingIndex::operator+(&local_110,(RawType)this_00);
  Sledge::RingIndex::get_max((RingIndex *)this_00);
  Sledge::RingIndex::operator+(&local_120,(RawType)this_00);
  testing::internal::EqHelper<false>::Compare<Sledge::RingIndex,Sledge::RingIndex>
            ((EqHelper<false> *)local_100,"ri + RingIndex::LIMIT_MAX",
             "ri + (RingIndex::LIMIT_MAX % ri.get_max())",&local_110,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndex1)
	{
		RingIndex ri(22, 23);
		EXPECT_EQ(++ri, 0);
		EXPECT_EQ(ri + 23, 0);
		EXPECT_EQ(ri + 24, 1);
		ri += 5;
		EXPECT_EQ(ri, 5);
		EXPECT_EQ(ri + RingIndex::LIMIT_MAX, ri + (RingIndex::LIMIT_MAX % ri.get_max()));
	}